

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injected.h
# Opt level: O0

ptr_type * __thiscall
inject::context<0>::injected<Inject::variable>::ptr(injected<Inject::variable> *this)

{
  element_type *peVar1;
  undefined1 local_20 [24];
  injected<Inject::variable> *this_local;
  
  local_20._16_8_ = this;
  peVar1 = boost::shared_ptr<Inject::variable>::get(&this->_ptr);
  if (peVar1 == (element_type *)0x0) {
    get_current();
    instance<Inject::variable>((context<0> *)local_20);
    boost::shared_ptr<Inject::variable>::operator=
              (&this->_ptr,(shared_ptr<Inject::variable> *)local_20);
    boost::shared_ptr<Inject::variable>::~shared_ptr((shared_ptr<Inject::variable> *)local_20);
  }
  return &this->_ptr;
}

Assistant:

const ptr_type& ptr() const {
      if (_ptr.get() == 0) {
        *const_cast<ptr_type*>(&_ptr) =
          context<ID>::get_current().template instance<T>();
      }
      return _ptr;
    }